

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdmiCecSimulationDataGenerator::GetInitTransaction(HdmiCecSimulationDataGenerator *this)

{
  HdmiCecSimulationDataGenerator *this_local;
  
  GenStartSeq(this);
  GenHeaderBlock(this,'\x03','\x03',true,false);
  AdvanceRand(this,5.0,10.0);
  GenStartSeq(this);
  GenHeaderBlock(this,'\x03','\x0f',false,false);
  AdvanceRand(this,0.2,0.8);
  GenDataBlock(this,0x84,false,false);
  AdvanceRand(this,0.2,0.8);
  GenDataBlock(this,'\x10',false,false);
  if (this->mErrorType == ERR_WRONGEOM) {
    GenDataBlock(this,'\0',true,false);
    this->mErrorType = ERR_NOERROR;
  }
  else {
    GenDataBlock(this,'\0',false,false);
  }
  GenDataBlock(this,'\x03',true,false);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GetInitTransaction()
{
    // Tuner1 sends a header block to it's same address to verify that no one
    // ACKs the block (ie. the logical address is available)
    GenStartSeq();
    GenHeaderBlock( HdmiCec::DevAddress_Tuner1, HdmiCec::DevAddress_Tuner1, true, false );

    // Tuner1 reports physical address to bcast
    AdvanceRand( 5.0f, 10.0f );
    GenStartSeq();
    GenHeaderBlock( HdmiCec::DevAddress_Tuner1, HdmiCec::DevAddress_UnregBcast, false, false );
    AdvanceRand( 0.2f, 0.8f );
    GenDataBlock( HdmiCec::OpCode_ReportPhysicalAddress, false, false );
    AdvanceRand( 0.2f, 0.8f );
    GenDataBlock( 0x10, false, false );
    if( mErrorType == ERR_WRONGEOM )
    {
        GenDataBlock( 0x00, true, false );
        mErrorType = ERR_NOERROR;
    }
    else
    {
        GenDataBlock( 0x00, false, false );
    }
    GenDataBlock( 0x03, true, false );
}